

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O3

void __thiscall
mocker::nasm::Section::emplaceLine<mocker::nasm::Jmp,std::shared_ptr<mocker::nasm::Label>>
          (Section *this,string *label,shared_ptr<mocker::nasm::Label> *args)

{
  size_t *psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Node *p_Var4;
  shared_ptr<mocker::nasm::Jmp> local_30;
  
  local_30.super___shared_ptr<mocker::nasm::Jmp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  (local_30.super___shared_ptr<mocker::nasm::Jmp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_30.super___shared_ptr<mocker::nasm::Jmp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_30.super___shared_ptr<mocker::nasm::Jmp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e92a8;
  local_30.super___shared_ptr<mocker::nasm::Jmp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_30.super___shared_ptr<mocker::nasm::Jmp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       + 1);
  peVar2 = (args->super___shared_ptr<mocker::nasm::Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (args->super___shared_ptr<mocker::nasm::Label,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (args->super___shared_ptr<mocker::nasm::Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (args->super___shared_ptr<mocker::nasm::Label,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_30.super___shared_ptr<mocker::nasm::Jmp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__Jmp_001e92f8;
  *(element_type **)
   &local_30.super___shared_ptr<mocker::nasm::Jmp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = peVar2;
  local_30.super___shared_ptr<mocker::nasm::Jmp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)p_Var3;
  p_Var4 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
           _M_create_node<std::__cxx11::string,std::shared_ptr<mocker::nasm::Jmp>>
                     ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&this->lines,
                      label,&local_30);
  std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
  psVar1 = &(this->lines).super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_30.super___shared_ptr<mocker::nasm::Jmp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<mocker::nasm::Jmp,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void emplaceLine(std::string label, Args &&... args) {
    lines.emplace_back(std::move(label),
                       std::make_shared<Type>(std::forward<Args>(args)...));
  }